

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O1

void __thiscall cppcms::rpc::json_rpc_server::main(json_rpc_server *this,string param_1)

{
  shared_ptr<cppcms::rpc::json_call> *this_00;
  element_type *peVar1;
  pointer pcVar2;
  char cVar3;
  int iVar4;
  level_type lVar5;
  request *this_01;
  response *prVar6;
  ostream *poVar7;
  json_call *this_02;
  context *c;
  iterator iVar8;
  bool bVar9;
  key_type local_c8;
  undefined1 local_a8 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_68;
  string local_50;
  
  if ((this->smd_)._M_string_length == 0) {
    bVar9 = false;
  }
  else {
    this_01 = application::request(&this->super_application);
    http::request::request_method_abi_cxx11_(&local_50,this_01);
    iVar4 = std::__cxx11::string::compare((char *)&local_50);
    bVar9 = iVar4 == 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  if (bVar9) {
    prVar6 = application::response(&this->super_application);
    local_a8._0_8_ = (context *)(local_a8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"application/json","");
    http::response::set_content_header(prVar6,(string *)local_a8);
    if ((context *)local_a8._0_8_ != (context *)(local_a8 + 0x10)) {
      operator_delete((void *)local_a8._0_8_);
    }
    prVar6 = application::response(&this->super_application);
    poVar7 = http::response::out(prVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(this->smd_)._M_dataplus._M_p,(this->smd_)._M_string_length);
    bVar9 = application::is_asynchronous(&this->super_application);
    if (bVar9) {
      application::release_context((application *)local_a8);
      http::context::async_complete_response((context *)local_a8._0_8_);
      if ((_data *)local_a8._8_8_ != (_data *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
      }
    }
  }
  else {
    this_02 = (json_call *)operator_new(0x60);
    c = application::context(&this->super_application);
    json_call::json_call(this_02,c);
    this_00 = &this->current_call_;
    std::__shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>::
    reset<cppcms::rpc::json_call>
              (&this_00->super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>,
               this_02);
    lVar5 = booster::log::logger::instance();
    cVar3 = booster::log::logger::should_be_logged(lVar5,(char *)0x46);
    if (cVar3 != '\0') {
      booster::log::message::message
                ((message *)local_a8,debug,"cppcms",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/rpc_json.cpp"
                 ,0xa2);
      poVar7 = (ostream *)booster::log::message::out();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"JSON-RPC Method call:",0x15);
      check_call(this);
      peVar1 = (this_00->super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      pcVar2 = (peVar1->method_)._M_dataplus._M_p;
      local_78 = &local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar2,pcVar2 + (peVar1->method_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_78,local_70);
      if (cVar3 != '\0') {
        if (local_78 != &local_68) {
          operator_delete(local_78);
        }
        booster::log::message::~message((message *)local_a8);
      }
    }
    check_call(this);
    peVar1 = (this_00->super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    pcVar2 = (peVar1->method_)._M_dataplus._M_p;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar2,pcVar2 + (peVar1->method_)._M_string_length);
    iVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>_>
            ::find(&(this->methods_)._M_t,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if ((_Rb_tree_header *)iVar8._M_node == &(this->methods_)._M_t._M_impl.super__Rb_tree_header) {
      check_call(this);
      if (((this_00->super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
          ->notification_ != false) {
        return;
      }
      json::value::value<char[17]>((value *)&local_c8,(char (*) [17])"Method not found");
      return_error(this,(value *)&local_c8);
    }
    else {
      if ((iVar8._M_node[3]._M_color != 2) ||
         (check_call(this),
         ((this_00->super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
         ->notification_ != false)) {
        if ((iVar8._M_node[3]._M_color == _S_black) &&
           (check_call(this),
           ((this_00->super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           )->notification_ != false)) {
          return;
        }
        check_call(this);
        if (iVar8._M_node[2]._M_left != (_Base_ptr)0x0) {
          (*(code *)iVar8._M_node[2]._M_right)
                    (iVar8._M_node + 2,
                     &((this_00->
                       super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->params_);
          return;
        }
        std::__throw_bad_function_call();
      }
      json::value::value<char[35]>
                ((value *)&local_c8,(char (*) [35])"The request should be notification");
      return_error(this,(value *)&local_c8);
    }
    json::value::copyable::~copyable((copyable *)&local_c8);
  }
  return;
}

Assistant:

void json_rpc_server::main(std::string /*unused*/)
	{
		if(!smd_.empty() && request().request_method()=="GET") {

			response().set_content_header("application/json");
			response().out() << smd_;

			if(is_asynchronous())
				release_context()->async_complete_response();
			return;
		}

		try {
			current_call_.reset(new json_call(context()));
			BOOSTER_DEBUG("cppcms") << "JSON-RPC Method call:" << method();
			methods_map_type::iterator p=methods_.find(method());
			if(p==methods_.end()) {
				if(!notification())
					return_error("Method not found");
				return;
			}
			if(p->second.role == notification_role && !notification()) {
				return_error("The request should be notification");
				return;
			}
			if(p->second.role == method_role && notification()) {
				// No way to respond according to protocol
				return;
			}
			try {
				p->second.method(params());
			}
			catch(json::bad_value_cast const &e) {
				if(current_call_.get() && !notification())
					return_error("Invalid parameters");
				return;
			}
			catch(call_error const &e) {
				if(current_call_.get() && !notification())
					return_error(e.what());
				return;
			}
			catch(std::exception const &e) {
				if(current_call_.get() && !notification())
					return_error("Internal Service Error");
				return;
			}
		}
		catch(call_error const &e)
		{
			response().set_content_header("text/plain");
			response().out()<< e.what() << std::endl;
		}
	}